

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O3

void __thiscall
embree::TutorialApplication::motionFunc
          (TutorialApplication *this,GLFWwindow *window,double x,double y)

{
  int iVar1;
  float fVar2;
  float fVar3;
  ImGuiIO *pIVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  ImGui_ImplGlfw_CursorPosCallback(window,x,y);
  pIVar4 = ImGui::GetIO();
  if (pIVar4->WantCaptureMouse == false) {
    fVar5 = (float)(this->clickX - x);
    fVar9 = (float)(this->clickY - y);
    this->clickX = x;
    this->clickY = y;
    iVar1 = this->mouseMode;
    if (iVar1 == 4) {
      Camera::rotate(&this->camera,fVar5 * -0.005,fVar9 * 0.005);
      return;
    }
    if (iVar1 == 3) {
      fVar6 = powf(0.99,-fVar9);
      fVar5 = (this->camera).from.field_0.m128[0];
      fVar9 = (this->camera).from.field_0.m128[1];
      fVar2 = (this->camera).from.field_0.m128[2];
      fVar3 = (this->camera).from.field_0.m128[3];
      fVar10 = (this->camera).to.field_0.m128[0] - fVar5;
      fVar11 = (this->camera).to.field_0.m128[1] - fVar9;
      fVar12 = (this->camera).to.field_0.m128[2] - fVar2;
      fVar13 = (this->camera).to.field_0.m128[3] - fVar3;
      fVar14 = fVar11 * fVar11;
      fVar15 = fVar12 * fVar12;
      fVar16 = fVar13 * fVar13;
      fVar17 = fVar14 + fVar10 * fVar10 + fVar15;
      fVar18 = fVar14 + fVar14 + fVar16;
      fVar15 = fVar14 + fVar15 + fVar15;
      fVar16 = fVar14 + fVar16 + fVar16;
      fVar14 = (1.0 - fVar6) * SQRT(fVar17);
      auVar7._4_4_ = fVar18;
      auVar7._0_4_ = fVar17;
      auVar7._8_4_ = fVar15;
      auVar7._12_4_ = fVar16;
      auVar8._4_4_ = fVar18;
      auVar8._0_4_ = fVar17;
      auVar8._8_4_ = fVar15;
      auVar8._12_4_ = fVar16;
      auVar8 = rsqrtss(auVar7,auVar8);
      fVar6 = auVar8._0_4_;
      fVar6 = fVar6 * fVar6 * fVar17 * -0.5 * fVar6 + fVar6 * 1.5;
      (this->camera).from.field_0.m128[0] = fVar14 * fVar6 * fVar10 + fVar5;
      (this->camera).from.field_0.m128[1] = fVar14 * fVar6 * fVar11 + fVar9;
      (this->camera).from.field_0.m128[2] = fVar14 * fVar6 * fVar12 + fVar2;
      (this->camera).from.field_0.m128[3] = fVar14 * fVar6 * fVar13 + fVar3;
    }
    else if (iVar1 == 1) {
      Camera::rotateOrbit(&this->camera,fVar5 * -0.005,fVar9 * 0.005);
      return;
    }
  }
  return;
}

Assistant:

void TutorialApplication::motionFunc(GLFWwindow* window, double x, double y)
  {
    ImGui_ImplGlfw_CursorPosCallback(window, x, y);
    if (ImGui::GetIO().WantCaptureMouse) return;
  
    float dClickX = float(clickX - x), dClickY = float(clickY - y);
    clickX = x; clickY = y;

    switch (mouseMode) {
    case 1: camera.rotateOrbit(-0.005f*dClickX,0.005f*dClickY); break;
    case 2: break;
    case 3: camera.dolly(-dClickY); break;
    case 4: camera.rotate(-0.005f*dClickX,0.005f*dClickY); break;
    }
  }